

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

Bond * __thiscall OpenMD::SelectionManager::nextUnselectedBond(SelectionManager *this,int *i)

{
  int iVar1;
  reference ppBVar2;
  int *in_RSI;
  OpenMDBitSet *in_RDI;
  undefined8 in_stack_ffffffffffffffe0;
  value_type pBVar3;
  
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
             &(in_RDI->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,1);
  iVar1 = OpenMDBitSet::nextOffBit(in_RDI,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  *in_RSI = iVar1;
  if (*in_RSI == -1) {
    pBVar3 = (value_type)0x0;
  }
  else {
    ppBVar2 = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                        ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RDI + 2),
                         (long)*in_RSI);
    pBVar3 = *ppBVar2;
  }
  return pBVar3;
}

Assistant:

Bond* SelectionManager::nextUnselectedBond(int& i) {
#ifdef IS_MPI
    ++i;
    while (i < static_cast<int>(ss_.bitsets_[BOND].size())) {
      if (!ss_.bitsets_[BOND][i]) {
        // check that this processor owns this bond
        if (bonds_[i] != NULL) return bonds_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[BOND].nextOffBit(i);
    return i == -1 ? NULL : bonds_[i];
#endif
  }